

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O2

char * create_terminal_action_spec(FMStructDescList format_list)

{
  char **ppcVar1;
  FMStructDescList p_Var2;
  char *__s;
  ulong uVar3;
  bool bVar4;
  
  uVar3 = 0xffffffffffffffff;
  p_Var2 = format_list;
  do {
    uVar3 = uVar3 + 1;
    ppcVar1 = &p_Var2->format_name;
    p_Var2 = p_Var2 + 1;
  } while (*ppcVar1 != (char *)0x0);
  __s = (char *)INT_CMmalloc(0x32);
  sprintf(__s,"Terminal Action   Format Count %d\n",uVar3 & 0xffffffff);
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    __s = add_FMfieldlist_to_string(__s,format_list);
    format_list = format_list + 1;
  }
  return __s;
}

Assistant:

char *
create_terminal_action_spec(FMStructDescList format_list)
{
    int format_count = 0;
    int i;
    char *str;
    while(format_list[format_count].format_name != NULL) format_count++;
    str = malloc(50);
    sprintf(str, "Terminal Action   Format Count %d\n", format_count);

    for (i = 0 ; i < format_count; i++) {
	str = add_FMfieldlist_to_string(str, &format_list[i]);
    }
    return str;
}